

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.h
# Opt level: O0

uint8_t get_segment_id(CommonModeInfoParams *mi_params,uint8_t *segment_ids,BLOCK_SIZE bsize,
                      int mi_row,int mi_col)

{
  int iVar1;
  uint local_48;
  uint local_44;
  int x;
  int y;
  uint8_t segment_id;
  int seg_stride;
  int ymis;
  int xmis;
  int bh;
  int bw;
  int mi_offset;
  int mi_col_local;
  int mi_row_local;
  BLOCK_SIZE bsize_local;
  uint8_t *segment_ids_local;
  CommonModeInfoParams *mi_params_local;
  
  iVar1 = mi_row * mi_params->mi_cols + mi_col;
  local_44 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [bsize];
  local_48 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [bsize];
  if (mi_params->mi_cols - mi_col < (int)local_44) {
    local_44 = mi_params->mi_cols - mi_col;
  }
  if (mi_params->mi_rows - mi_row < (int)local_48) {
    local_48 = mi_params->mi_rows - mi_row;
  }
  segment_id = '\b';
  for (y = 0; y < (int)local_48; y = y + 1) {
    for (x = 0; x < (int)local_44; x = x + 1) {
      if (segment_ids[iVar1 + y * mi_params->mi_cols + x] <= segment_id) {
        segment_id = segment_ids[iVar1 + y * mi_params->mi_cols + x];
      }
    }
  }
  return segment_id;
}

Assistant:

static inline uint8_t get_segment_id(
    const CommonModeInfoParams *const mi_params, const uint8_t *segment_ids,
    BLOCK_SIZE bsize, int mi_row, int mi_col) {
  const int mi_offset = mi_row * mi_params->mi_cols + mi_col;
  const int bw = mi_size_wide[bsize];
  const int bh = mi_size_high[bsize];
  const int xmis = AOMMIN(mi_params->mi_cols - mi_col, bw);
  const int ymis = AOMMIN(mi_params->mi_rows - mi_row, bh);
  const int seg_stride = mi_params->mi_cols;
  uint8_t segment_id = MAX_SEGMENTS;

  for (int y = 0; y < ymis; ++y) {
    for (int x = 0; x < xmis; ++x) {
      segment_id =
          AOMMIN(segment_id, segment_ids[mi_offset + y * seg_stride + x]);
    }
  }

  assert(segment_id < MAX_SEGMENTS);
  return segment_id;
}